

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O1

void asmjit::ConstPool_addGap(ConstPool *self,size_t offset,size_t length)

{
  Zone *this;
  Gap *pGVar1;
  size_t sVar2;
  ulong uVar3;
  
  while( true ) {
    if (length == 0) {
      return;
    }
    if (length < 0x10 || (offset & 0xf) != 0) {
      if (length < 8 || (offset & 7) != 0) {
        if (length < 4 || (offset & 3) != 0) {
          uVar3 = (ulong)((offset & 1) == 0 && length != 1);
          sVar2 = uVar3 + 1;
        }
        else {
          sVar2 = 4;
          uVar3 = 2;
        }
      }
      else {
        sVar2 = 8;
        uVar3 = 3;
      }
    }
    else {
      sVar2 = 0x10;
      uVar3 = 4;
    }
    pGVar1 = self->_gapPool;
    if (pGVar1 == (Gap *)0x0) {
      this = self->_zone;
      pGVar1 = (Gap *)this->_ptr;
      if ((ulong)((long)this->_end - (long)pGVar1) < 0x18) {
        pGVar1 = (Gap *)Zone::_alloc(this,0x18);
      }
      else {
        this->_ptr = (uint8_t *)(pGVar1 + 1);
        if ((Gap *)this->_end < pGVar1 + 1) {
          ConstPool_addGap();
        }
      }
    }
    else {
      self->_gapPool = pGVar1->_next;
    }
    if (pGVar1 == (Gap *)0x0) break;
    pGVar1->_next = self->_gaps[uVar3];
    self->_gaps[uVar3] = pGVar1;
    pGVar1->_offset = offset;
    pGVar1->_length = sVar2;
    offset = offset + sVar2;
    length = length - sVar2;
  }
  return;
}

Assistant:

static void ConstPool_addGap(ConstPool* self, size_t offset, size_t length) noexcept {
  ASMJIT_ASSERT(length > 0);

  while (length > 0) {
    size_t gapIndex;
    size_t gapLength;

      gapIndex = ConstPool::kIndex16;
    if (length >= 16 && Utils::isAligned<size_t>(offset, 16)) {
      gapLength = 16;
    }
    else if (length >= 8 && Utils::isAligned<size_t>(offset, 8)) {
      gapIndex = ConstPool::kIndex8;
      gapLength = 8;
    }
    else if (length >= 4 && Utils::isAligned<size_t>(offset, 4)) {
      gapIndex = ConstPool::kIndex4;
      gapLength = 4;
    }
    else if (length >= 2 && Utils::isAligned<size_t>(offset, 2)) {
      gapIndex = ConstPool::kIndex2;
      gapLength = 2;
    }
    else {
      gapIndex = ConstPool::kIndex1;
      gapLength = 1;
    }

    // We don't have to check for errors here, if this failed nothing really
    // happened (just the gap won't be visible) and it will fail again at
    // place where checking will cause kErrorNoHeapMemory.
    ConstPool::Gap* gap = ConstPool_allocGap(self);
    if (!gap) return;

    gap->_next = self->_gaps[gapIndex];
    self->_gaps[gapIndex] = gap;

    gap->_offset = offset;
    gap->_length = gapLength;

    offset += gapLength;
    length -= gapLength;
  }
}